

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanical.cpp
# Opt level: O1

bool __thiscall Mechanization::UpdatePosi(Mechanization *this,Output now)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  ELLIPSOID type;
  ELLIPSOID type_00;
  Euler eu;
  ELLIPSOID type_01;
  ELLIPSOID type_02;
  long lVar7;
  Mechanization *pMVar8;
  double *pdVar9;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> **ppMVar10;
  QuaternionBase<Eigen::Quaternion<double,_0>_> *pQVar11;
  undefined8 *puVar12;
  double *pdVar13;
  double *pdVar14;
  Matrix3d *pMVar15;
  Matrix3d *C;
  undefined8 *puVar16;
  byte bVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar27;
  double dVar28;
  ELLIPSOID in_stack_fffffffffffffba8;
  double in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  double in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc90 [40];
  double dStack_328;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *apMStack_308 [2];
  undefined1 *puStack_2f8;
  double *pdStack_2f0;
  QuaternionBase<Eigen::Quaternion<double,_0>_> *pQStack_2e8;
  undefined8 uStack_2d8;
  undefined8 uStack_2c0;
  QuaternionBase<Eigen::Quaternion<double,_0>_> aQStack_2b0 [40];
  Euler in_stack_fffffffffffffd78;
  Vector3d VStack_260;
  undefined1 auStack_240 [16];
  double dStack_230;
  Vector3d VStack_220;
  undefined8 in_stack_fffffffffffffdf8;
  double dVar29;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  Vector3d VStack_1c0;
  Matrix<double,_3,_1,_0,_3,_1> MStack_1a8;
  double adStack_190 [3];
  Matrix<double,_3,_1,_0,_3,_1> MStack_178;
  QuaternionBase<Eigen::Quaternion<double,_0>_> aQStack_160 [32];
  QuaternionBase<Eigen::Quaternion<double,_0>_> aQStack_140 [32];
  undefined4 uStack_120;
  uint uStack_11c;
  undefined4 uStack_118;
  uint uStack_114;
  undefined4 uStack_110;
  uint uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  Quaterniond QStack_100;
  QuaternionBase<Eigen::Quaternion<double,_0>_> aQStack_e0 [32];
  Matrix3d MStack_c0;
  Mechanization *pMStack_78;
  undefined1 in_stack_ffffffffffffffa8 [16];
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0 [32];
  
  bVar17 = 0;
  dVar29 = (this->prvPosi).B;
  (this->nowPosi).H =
       (this->prvPosi).H -
       (((this->prvVel).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2] +
        (this->nowVel).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
        .array[2]) * 0.5) / 200.0;
  pMVar8 = this;
  pdVar13 = (double *)&stack0xffffffffffffffa8;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pdVar13 = (pMVar8->type).a;
    pMVar8 = (Mechanization *)&(pMVar8->type).b;
    pdVar13 = pdVar13 + 1;
  }
  type_01.c = (double)in_stack_ffffffffffffffb8;
  type_01.a = (double)in_stack_ffffffffffffffa8._0_8_;
  type_01.b = (double)in_stack_ffffffffffffffa8._8_8_;
  type_01.alpha = (double)in_stack_ffffffffffffffc0;
  type_01.e2 = (double)in_stack_ffffffffffffffc8;
  type_01.e1_2 = (double)in_stack_ffffffffffffffd0._0_8_;
  type_01.gama_a = (double)in_stack_ffffffffffffffd0._8_8_;
  type_01.gama_b = (double)in_stack_ffffffffffffffd0._16_8_;
  type_01.GM = (double)in_stack_ffffffffffffffd0._24_8_;
  dVar20 = RM(dVar29,type_01);
  dVar29 = (this->prvPosi).B;
  dVar20 = ((((this->nowVel).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] +
             (this->prvVel).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0]) * 0.5) / (dVar20 + ((this->prvPosi).H + (this->nowPosi).H) * 0.5)) /
           200.0 + dVar29;
  (this->nowPosi).B = dVar20;
  pMVar8 = this;
  pdVar13 = (double *)&stack0xffffffffffffffa8;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pdVar13 = (pMVar8->type).a;
    pMVar8 = (Mechanization *)((long)pMVar8 + (ulong)bVar17 * -0x10 + 8);
    pdVar13 = pdVar13 + (ulong)bVar17 * -2 + 1;
  }
  type_02.c = (double)in_stack_ffffffffffffffb8;
  type_02.a = (double)in_stack_ffffffffffffffa8._0_8_;
  type_02.b = (double)in_stack_ffffffffffffffa8._8_8_;
  type_02.alpha = (double)in_stack_ffffffffffffffc0;
  type_02.e2 = (double)in_stack_ffffffffffffffc8;
  type_02.e1_2 = (double)in_stack_ffffffffffffffd0._0_8_;
  type_02.gama_a = (double)in_stack_ffffffffffffffd0._8_8_;
  type_02.gama_b = (double)in_stack_ffffffffffffffd0._16_8_;
  type_02.GM = (double)in_stack_ffffffffffffffd0._24_8_;
  RN((dVar20 + dVar29) * 0.5,type_02);
  pMStack_78 = this;
  uStack_1e0 = in_stack_ffffffffffffffb8;
  uStack_1d8 = in_stack_ffffffffffffffc0;
  uStack_1d0 = in_stack_ffffffffffffffc8;
  dVar29 = pdVar13[0x1c];
  dVar20 = pdVar13[0x1d];
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&stack0xfffffffffffffe00,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&uStack_1e0);
  pdStack_2f0 = (double *)0x3fb5555555555555;
  apMStack_308[0] = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&uStack_1e0;
  pQStack_2e8 = aQStack_2b0;
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&MStack_178,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)apMStack_308);
  VStack_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = MStack_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
  VStack_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = MStack_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
  VStack_220.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = MStack_178.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
  Vec2Qua((Quaterniond *)aQStack_e0,&VStack_220);
  dVar21 = (pdVar13[0xf] + pdVar13[0x12]) * 0.5;
  dVar27 = (pdVar13[0x11] + pdVar13[0x14]) * 0.5;
  pdVar9 = pdVar13;
  ppMVar10 = apMStack_308;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *ppMVar10 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)*pdVar9;
    pdVar9 = pdVar9 + (ulong)bVar17 * -2 + 1;
    ppMVar10 = ppMVar10 + (ulong)bVar17 * -2 + 1;
  }
  dVar4 = pdVar13[0x15];
  dVar28 = pdVar13[0x16];
  dVar5 = pdVar13[0x18];
  dVar6 = pdVar13[0x19];
  pdVar9 = pdVar13;
  pdVar14 = (double *)&stack0xfffffffffffffc70;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pdVar14 = *pdVar9;
    pdVar9 = pdVar9 + (ulong)bVar17 * -2 + 1;
    pdVar14 = pdVar14 + (ulong)bVar17 * -2 + 1;
  }
  type.b = (double)in_stack_fffffffffffffc78;
  type.a = in_stack_fffffffffffffc70;
  type.c = (double)in_stack_fffffffffffffc80;
  type.alpha = in_stack_fffffffffffffc88;
  type.e2 = (double)in_stack_fffffffffffffc90._0_8_;
  type.e1_2 = (double)in_stack_fffffffffffffc90._8_8_;
  type.gama_a = (double)in_stack_fffffffffffffc90._16_8_;
  type.gama_b = (double)in_stack_fffffffffffffc90._24_8_;
  type.GM = (double)in_stack_fffffffffffffc90._32_8_;
  dVar1 = RN(dVar21,type);
  ppMVar10 = apMStack_308;
  puVar12 = (undefined8 *)&stack0xfffffffffffffc70;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar12 = *ppMVar10;
    ppMVar10 = ppMVar10 + (ulong)bVar17 * -2 + 1;
    puVar12 = puVar12 + (ulong)bVar17 * -2 + 1;
  }
  type_00.b = (double)in_stack_fffffffffffffc78;
  type_00.a = in_stack_fffffffffffffc70;
  type_00.c = (double)in_stack_fffffffffffffc80;
  type_00.alpha = in_stack_fffffffffffffc88;
  type_00.e2 = (double)in_stack_fffffffffffffc90._0_8_;
  type_00.e1_2 = (double)in_stack_fffffffffffffc90._8_8_;
  type_00.gama_a = (double)in_stack_fffffffffffffc90._16_8_;
  type_00.gama_b = (double)in_stack_fffffffffffffc90._24_8_;
  type_00.GM = (double)in_stack_fffffffffffffc90._32_8_;
  dVar2 = RM(dVar21,type_00);
  dVar28 = (dVar6 + dVar28) * 0.5;
  dVar2 = dVar2 + dVar27;
  dVar1 = dVar1 + dVar27;
  uVar18 = SUB84(dVar1,0);
  uVar19 = (undefined4)((ulong)dVar1 >> 0x20);
  auVar25._8_4_ = uVar18;
  auVar25._0_8_ = dVar2;
  auVar25._12_4_ = uVar19;
  auVar22._8_8_ = dVar28;
  auVar22._0_8_ = (dVar5 + dVar4) * -0.5;
  auVar23._8_4_ = uVar18;
  auVar23._0_8_ = dVar2;
  auVar23._12_4_ = uVar19;
  auVar23 = divpd(auVar22,auVar23);
  dVar27 = tan(dVar21);
  dStack_328 = auVar25._8_8_;
  dStack_230 = (dVar27 * -dVar28) / dStack_328;
  auStack_240._0_8_ = auVar23._8_8_;
  auStack_240._8_4_ = auVar23._0_4_;
  auStack_240._12_4_ = auVar23._4_4_;
  dVar27 = cos(dVar21);
  adStack_190[2] = sin(dVar21);
  adStack_190[2] = adStack_190[2] * -7.292115e-05;
  pdStack_2f0 = adStack_190;
  adStack_190[1] = 0.0;
  uStack_2d8 = 0x3ff0000000000000;
  uStack_2c0 = 0x4069000000000000;
  puStack_2f8 = auStack_240;
  adStack_190[0] = dVar27 * 7.292115e-05;
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&MStack_1a8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)apMStack_308);
  VStack_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = MStack_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
  VStack_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = MStack_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
  VStack_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = MStack_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
  Vec2Qua(&QStack_100,&VStack_260);
  uStack_120 = QStack_100.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[0]._0_4_;
  uStack_11c = QStack_100.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[0]._4_4_ ^ 0x80000000;
  uStack_118 = QStack_100.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[1]._0_4_;
  uStack_114 = QStack_100.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[1]._4_4_ ^ 0x80000000;
  uVar26 = QStack_100.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
           m_storage.m_data.array[2]._4_4_ ^ 0x80000000;
  uStack_110 = QStack_100.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[2]._0_4_;
  uStack_10c = uVar26;
  uStack_108 = QStack_100.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3]._0_4_;
  uStack_104 = QStack_100.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3]._4_4_;
  Eu2Ro(in_stack_fffffffffffffd78);
  dVar21 = pdVar13[10];
  eu.pitch = dVar29;
  eu.roll = (double)in_stack_fffffffffffffdf8;
  eu.yaw = dVar20;
  Eu2Qu(eu);
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
            ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)&uStack_120,aQStack_140);
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*(aQStack_2b0,aQStack_e0);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::normalize(aQStack_160);
  Eigen::RotationBase<Eigen::Quaternion<double,_0>,_3>::matrix
            ((RotationBase<Eigen::Quaternion<double,_0>,_3> *)aQStack_160);
  C = &MStack_c0;
  pQVar11 = aQStack_2b0;
  pMVar15 = C;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
    [0] = *(double *)pQVar11;
    pQVar11 = pQVar11 + ((ulong)bVar17 * -2 + 1) * 8;
    pMVar15 = (Matrix3d *)((long)pMVar15 + ((ulong)bVar17 * -2 + 1) * 8);
  }
  uVar18 = QStack_100.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
           m_storage.m_data.array[2]._0_4_;
  CalculateEuler(C,&VStack_1c0);
  puVar12 = (undefined8 *)&stack0xfffffffffffffc90;
  puVar16 = (undefined8 *)&stack0xfffffffffffffba8;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar16 = *puVar12;
    puVar12 = puVar12 + (ulong)bVar17 * -2 + 1;
    puVar16 = puVar16 + (ulong)bVar17 * -2 + 1;
  }
  dVar29 = RN(dVar21,in_stack_fffffffffffffba8);
  puVar12 = (undefined8 *)&stack0xfffffffffffffc90;
  puVar16 = (undefined8 *)&stack0xfffffffffffffba8;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar16 = *puVar12;
    puVar12 = puVar12 + (ulong)bVar17 * -2 + 1;
    puVar16 = puVar16 + (ulong)bVar17 * -2 + 1;
  }
  dVar20 = RM(dVar21,in_stack_fffffffffffffba8);
  dVar21 = tan(dVar21);
  auVar24._4_4_ = extraout_XMM0_Db;
  auVar24._0_4_ = extraout_XMM0_Da;
  auVar24._8_8_ = CONCAT44(uVar26,uVar18) ^ 0x8000000000000000;
  auVar3._8_8_ = in_stack_fffffffffffffc88 + dVar20;
  auVar3._0_8_ = in_stack_fffffffffffffc88 + dVar29;
  auVar25 = divpd(auVar24,auVar3);
  *(undefined1 (*) [16])
   (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array =
       auVar25;
  (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       (dVar21 * -(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) /
       (in_stack_fffffffffffffc88 + dVar29);
  return SUB81(C,0);
}

Assistant:

bool Mechanization::UpdatePosi(Output now) {
    this->nowPosi.H = prvPosi.H - 0.5 * (prvVel(2, 0) + nowVel(2, 0)) * 1.0 / ZCF;
    // cout << this->nowPosi.H << endl;

    double rm = RM(prvPosi.B, type);
    double h = 0.5 * (nowPosi.H + prvPosi.H);
    this->nowPosi.B = prvPosi.B + 0.5 * (prvVel(0, 0) + nowVel(0, 0)) / (rm + h) * 1.0 / ZCF;
    // cout << Rad2Deg(this->nowPosi.B) << endl;
    
    double phi = 0.5 * (prvPosi.B + nowPosi.B);
    double rn = RN(phi, type);
    // cout << setprecision(15) << rn << endl;
    this->nowPosi.L = prvPosi.L + 0.5 * (prvVel(1, 0) + nowVel(1, 0)) / ((rn + h) * cos(phi)) * 1.0 / ZCF;
    // cout << Rad2Deg(this->nowPosi.L) << endl;
}